

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cc
# Opt level: O3

string * __thiscall lrit::File::getTime_abi_cxx11_(string *__return_storage_ptr__,File *this)

{
  tm *__tp;
  size_t sVar1;
  timespec ts;
  array<char,_128UL> tsbuf;
  timespec local_a0;
  TimeStampHeader local_90 [10];
  
  local_90[0] = getHeader<lrit::TimeStampHeader>(&this->header_,&this->m_);
  local_a0 = TimeStampHeader::getUnix(local_90);
  __tp = gmtime(&local_a0.tv_sec);
  sVar1 = strftime((char *)local_90,0x80,"%Y%d%m-%H%M%S",__tp);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,local_90,local_90[0].ccsds + (sVar1 - 4));
  return __return_storage_ptr__;
}

Assistant:

std::string File::getTime() const {
  std::array<char, 128> tsbuf;
  auto ts = getHeader<lrit::TimeStampHeader>().getUnix();
  auto len = strftime(
    tsbuf.data(),
    tsbuf.size(),
    "%Y%d%m-%H%M%S",
    gmtime(&ts.tv_sec));
  return std::string(tsbuf.data(), len);
}